

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtUtil.c
# Opt level: O0

Rwt_Node_t * Rwt_ManAddVar(Rwt_Man_t *p,uint uTruth,int fPrecompute)

{
  Rwt_Node_t *pNode;
  Rwt_Node_t *pNew;
  int fPrecompute_local;
  uint uTruth_local;
  Rwt_Man_t *p_local;
  
  pNode = (Rwt_Node_t *)Mem_FixedEntryFetch(p->pMmNode);
  pNode->Id = p->vForest->nSize;
  pNode->TravId = 0;
  *(uint *)&pNode->field_0x8 = *(uint *)&pNode->field_0x8 & 0xffff0000 | uTruth & 0xffff;
  *(uint *)&pNode->field_0x8 = *(uint *)&pNode->field_0x8 & 0xc0ffffff;
  *(uint *)&pNode->field_0x8 = *(uint *)&pNode->field_0x8 & 0xff00ffff;
  *(uint *)&pNode->field_0x8 = *(uint *)&pNode->field_0x8 & 0xbfffffff | 0x40000000;
  *(uint *)&pNode->field_0x8 = *(uint *)&pNode->field_0x8 & 0x7fffffff;
  pNode->p0 = (Rwt_Node_t *)0x0;
  pNode->p1 = (Rwt_Node_t *)0x0;
  pNode->pNext = (Rwt_Node_t *)0x0;
  Vec_PtrPush(p->vForest,pNode);
  if (fPrecompute != 0) {
    Rwt_ListAddToTail(p->pTable + uTruth,pNode);
  }
  return pNode;
}

Assistant:

Rwt_Node_t * Rwt_ManAddVar( Rwt_Man_t * p, unsigned uTruth, int fPrecompute )
{
    Rwt_Node_t * pNew;
    pNew = (Rwt_Node_t *)Mem_FixedEntryFetch( p->pMmNode );
    pNew->Id     = p->vForest->nSize;
    pNew->TravId = 0;
    pNew->uTruth = uTruth;
    pNew->Level  = 0;
    pNew->Volume = 0;
    pNew->fUsed  = 1;
    pNew->fExor  = 0;
    pNew->p0     = NULL;
    pNew->p1     = NULL;
    pNew->pNext  = NULL;
    Vec_PtrPush( p->vForest, pNew );
    if ( fPrecompute )
        Rwt_ListAddToTail( p->pTable + uTruth, pNew );
    return pNew;
}